

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2UnicodeClasses(void)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  string str;
  string b;
  string a;
  string c;
  StringPiece local_258;
  LogMessage local_248;
  char *local_c8;
  int local_c0;
  char local_b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,anon_var_dwarf_33856,anon_var_dwarf_33856 + 0x12);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  RE2::RE2((RE2 *)&local_248,"\\p{L}");
  local_258.ptr_ = "A";
  local_258.length_ = 1;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x551,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: RE2::FullMatch(\"A\", \"\\\\p{L}\")",0x2b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{Lu}");
  local_258.ptr_ = "A";
  local_258.length_ = 1;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x552,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: RE2::FullMatch(\"A\", \"\\\\p{Lu}\")",0x2c)
    ;
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{Ll}");
  local_258.ptr_ = "A";
  local_258.length_ = 1;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x553,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: !(RE2::FullMatch(\"A\", \"\\\\p{Ll}\"))",
               0x2f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{L}");
  local_258.ptr_ = "A";
  local_258.length_ = 1;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x554,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: !(RE2::FullMatch(\"A\", \"\\\\P{L}\"))",
               0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{Lu}");
  local_258.ptr_ = "A";
  local_258.length_ = 1;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x555,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: !(RE2::FullMatch(\"A\", \"\\\\P{Lu}\"))",
               0x2f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{Ll}");
  local_258.ptr_ = "A";
  local_258.length_ = 1;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x556,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: RE2::FullMatch(\"A\", \"\\\\P{Ll}\")",0x2c)
    ;
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{L}");
  local_258.ptr_ = anon_var_dwarf_338f2;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x558,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_338fe,0x2d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{Lu}");
  local_258.ptr_ = anon_var_dwarf_338f2;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x559,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_3390a,0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{Ll}");
  local_258.ptr_ = anon_var_dwarf_338f2;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_33916,0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{L}");
  local_258.ptr_ = anon_var_dwarf_338f2;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_33922,0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{Lu}");
  local_258.ptr_ = anon_var_dwarf_338f2;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_3392e,0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{Ll}");
  local_258.ptr_ = anon_var_dwarf_338f2;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_3393a,0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{L}");
  local_258.ptr_ = anon_var_dwarf_33946;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_33952,0x2d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{Lu}");
  local_258.ptr_ = anon_var_dwarf_33946;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x560,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_3395e,0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{Ll}");
  local_258.ptr_ = anon_var_dwarf_33946;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x561,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_3396a,0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{L}");
  local_258.ptr_ = anon_var_dwarf_33946;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x562,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_33976,0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{Lu}");
  local_258.ptr_ = anon_var_dwarf_33946;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x563,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_33982,0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{Ll}");
  local_258.ptr_ = anon_var_dwarf_33946;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x564,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_3398e,0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{L}");
  local_258.ptr_ = anon_var_dwarf_33856 + 0xf;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x566,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_339a6,0x2d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{Lu}");
  local_258.ptr_ = anon_var_dwarf_33856 + 0xf;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x567,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_339b2,0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\p{Ll}");
  local_258.ptr_ = anon_var_dwarf_33856 + 0xf;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x568,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_339be,0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{L}");
  local_258.ptr_ = anon_var_dwarf_33856 + 0xf;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x569,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_339ca,0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{Lu}");
  local_258.ptr_ = anon_var_dwarf_33856 + 0xf;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_339d6,0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  RE2::RE2((RE2 *)&local_248,"\\P{Ll}");
  local_258.ptr_ = anon_var_dwarf_33856 + 0xf;
  local_258.length_ = 3;
  bVar2 = RE2::FullMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_339e2,0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  local_258.ptr_ = local_c8;
  local_258.length_ = local_c0;
  RE2::RE2((RE2 *)&local_248,"(.).*?(.).*?(.)");
  local_98 = &local_70;
  local_a0 = &local_90;
  local_a8 = &local_50;
  bVar2 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_258,(RE2 *)&local_248,&local_98,&local_a0,&local_a8);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,
               "Check failed: RE2::PartialMatch(str, \"(.).*?(.).*?(.)\", &a, &b, &c)",0x43);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"A\") == (a)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"B\") == (b)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x570,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"C\") == (c)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  local_258.ptr_ = local_c8;
  local_258.length_ = local_c0;
  RE2::RE2((RE2 *)&local_248,"(.).*?([\\p{L}]).*?(.)");
  local_a8 = &local_50;
  local_a0 = &local_90;
  local_98 = &local_70;
  bVar2 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_258,(RE2 *)&local_248,&local_98,&local_a0,&local_a8);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x572,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,
               "Check failed: RE2::PartialMatch(str, \"(.).*?([\\\\p{L}]).*?(.)\", &a, &b, &c)",0x4a
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x573,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"A\") == (a)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x574,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"B\") == (b)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x575,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"C\") == (c)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  pcVar1 = local_c8;
  RE2::RE2((RE2 *)&local_248,"\\P{L}");
  local_258.ptr_ = pcVar1;
  bVar2 = RE2::PartialMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x577,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: !(RE2::PartialMatch(str, \"\\\\P{L}\"))",
               0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  local_258.ptr_ = local_c8;
  local_258.length_ = local_c0;
  RE2::RE2((RE2 *)&local_248,"(.).*?([\\p{Lu}]).*?(.)");
  local_a8 = &local_50;
  local_a0 = &local_90;
  local_98 = &local_70;
  bVar2 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_258,(RE2 *)&local_248,&local_98,&local_a0,&local_a8);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x579,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,
               "Check failed: RE2::PartialMatch(str, \"(.).*?([\\\\p{Lu}]).*?(.)\", &a, &b, &c)",
               0x4b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"A\") == (a)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"B\") == (b)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,"Check failed: (\"C\") == (c)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  pcVar1 = local_c8;
  RE2::RE2((RE2 *)&local_248,"[^\\p{Lu}\\p{Lo}]");
  local_258.ptr_ = pcVar1;
  bVar2 = RE2::PartialMatchN(&local_258,(RE2 *)&local_248,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_248);
  if (bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,
               "Check failed: !(RE2::PartialMatch(str, \"[^\\\\p{Lu}\\\\p{Lo}]\"))",0x3c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  local_258.ptr_ = local_c8;
  local_258.length_ = local_c0;
  RE2::RE2((RE2 *)&local_248,".*(.).*?([\\p{Lu}\\p{Lo}]).*?(.)");
  local_a8 = &local_50;
  local_a0 = &local_90;
  local_98 = &local_70;
  bVar2 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_258,(RE2 *)&local_248,&local_98,&local_a0,&local_a8);
  RE2::~RE2((RE2 *)&local_248);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x580,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,
               "Check failed: RE2::PartialMatch(str, \".*(.).*?([\\\\p{Lu}\\\\p{Lo}]).*?(.)\", &a, &b, &c)"
               ,0x54);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x581,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_33a96,0x1c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x582,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_33aa2,0x1c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar3 != 0) {
    LogMessage::LogMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x583,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_248.str_,anon_var_dwarf_33aae,0x1c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}